

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::RepeatedMessageFieldGenerator::DetermineForwardDeclarations
          (RepeatedMessageFieldGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *fwd_decls)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  FieldGenerator *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  value_type *__x;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  value_type local_50;
  char *in_stack_ffffffffffffffd0;
  FieldGenerator *in_stack_ffffffffffffffd8;
  
  FieldGenerator::DetermineForwardDeclarations(in_RDI,in_RSI);
  __x = &local_50;
  FieldGenerator::variable_abi_cxx11_(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::operator+((char *)in_RDI,in_stack_ffffffffffffff70);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(in_stack_ffffffffffffff90,__x);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::DetermineForwardDeclarations(
    std::set<string>* fwd_decls) const {
  RepeatedFieldGenerator::DetermineForwardDeclarations(fwd_decls);
  // Class name is already in "storage_type".
  fwd_decls->insert("@class " + variable("storage_type"));
}